

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastSquare(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Wec_t *vProds;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *vLevels;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  
  iVar2 = nNum * 2;
  vProds = (Vec_Wec_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < nNum * 2 - 1U) {
    iVar11 = iVar2;
  }
  vProds->nSize = 0;
  vProds->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  vProds->pArray = pVVar7;
  vProds->nSize = iVar2;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nSize = 0;
  vLevels->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  vLevels->pArray = pVVar7;
  vLevels->nSize = iVar2;
  if (0 < nNum) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      uVar12 = 0;
      lVar9 = lVar10;
      do {
        iVar2 = (int)uVar8;
        iVar11 = (int)uVar12;
        if (uVar8 == uVar12) {
          iVar6 = pNum[uVar8];
          if (vProds->nSize <= iVar2 + iVar11) {
            uVar4 = vProds->nSize * 2;
            uVar5 = iVar2 + iVar11 + 1;
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            iVar1 = vProds->nCap;
            if (iVar1 < (int)uVar4) {
              if (vProds->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(vProds->pArray,(ulong)uVar4 << 4);
              }
              vProds->pArray = pVVar7;
              memset(pVVar7 + iVar1,0,(long)(int)(uVar4 - iVar1) << 4);
              vProds->nCap = uVar4;
            }
            vProds->nSize = iVar2 + iVar11 + 1;
          }
          if (vProds->nSize <= iVar2 + iVar11) {
LAB_008952cf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush((Vec_Int_t *)((long)&vProds->pArray->nCap + lVar9),iVar6);
          if (vLevels->nSize <= iVar2 + iVar11) {
            uVar4 = vLevels->nSize * 2;
            uVar5 = iVar2 + iVar11 + 1;
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            iVar6 = vLevels->nCap;
            if (iVar6 < (int)uVar4) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
              }
              vLevels->pArray = pVVar7;
              memset(pVVar7 + iVar6,0,(long)(int)(uVar4 - iVar6) << 4);
              vLevels->nCap = uVar4;
            }
            vLevels->nSize = iVar2 + iVar11 + 1;
          }
          if (vLevels->nSize <= iVar2 + iVar11) goto LAB_008952cf;
          pVVar7 = vLevels->pArray;
LAB_008951b0:
          Vec_IntPush((Vec_Int_t *)((long)&pVVar7->nCap + lVar9),0);
        }
        else if (uVar8 < uVar12) {
          iVar6 = Gia_ManHashAnd(pNew,pNum[uVar8],pNum[uVar12]);
          if (vProds->nSize <= iVar2 + iVar11 + 1) {
            uVar4 = vProds->nSize * 2;
            uVar5 = iVar2 + iVar11 + 2;
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            iVar1 = vProds->nCap;
            if (iVar1 < (int)uVar4) {
              if (vProds->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(vProds->pArray,(ulong)uVar4 << 4);
              }
              vProds->pArray = pVVar7;
              memset(pVVar7 + iVar1,0,(long)(int)(uVar4 - iVar1) << 4);
              vProds->nCap = uVar4;
            }
            vProds->nSize = iVar2 + iVar11 + 2;
          }
          if (vProds->nSize <= iVar2 + iVar11 + 1) goto LAB_008952cf;
          Vec_IntPush((Vec_Int_t *)((long)&vProds->pArray[1].nCap + lVar9),iVar6);
          if (vLevels->nSize <= iVar2 + iVar11 + 1) {
            uVar4 = vLevels->nSize * 2;
            uVar5 = iVar2 + iVar11 + 2;
            if ((int)uVar4 <= (int)uVar5) {
              uVar4 = uVar5;
            }
            iVar6 = vLevels->nCap;
            if (iVar6 < (int)uVar4) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
              }
              vLevels->pArray = pVVar7;
              memset(pVVar7 + iVar6,0,(long)(int)(uVar4 - iVar6) << 4);
              vLevels->nCap = uVar4;
            }
            vLevels->nSize = iVar2 + iVar11 + 2;
          }
          if (vLevels->nSize <= iVar2 + iVar11 + 1) goto LAB_008952cf;
          pVVar7 = vLevels->pArray + 1;
          goto LAB_008951b0;
        }
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 0x10;
      } while ((uint)nNum != uVar12);
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar8 != (uint)nNum);
  }
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,0,0);
  iVar2 = vProds->nCap;
  if (0 < (long)iVar2) {
    pVVar7 = vProds->pArray;
    lVar10 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar7->pArray + lVar10);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar7->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar10);
  }
  if (vProds->pArray != (Vec_Int_t *)0x0) {
    free(vProds->pArray);
    vProds->pArray = (Vec_Int_t *)0x0;
  }
  vProds->nCap = 0;
  vProds->nSize = 0;
  free(vProds);
  iVar2 = vLevels->nCap;
  if (0 < (long)iVar2) {
    pVVar7 = vLevels->pArray;
    lVar10 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar7->pArray + lVar10);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar7->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar10);
  }
  if (vLevels->pArray != (Vec_Int_t *)0x0) {
    free(vLevels->pArray);
    vLevels->pArray = (Vec_Int_t *)0x0;
  }
  vLevels->nCap = 0;
  vLevels->nSize = 0;
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastSquare( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( 2*nNum );
    Vec_Wec_t * vLevels = Vec_WecStart( 2*nNum );
    int i, k;
    for ( i = 0; i < nNum; i++ )
        for ( k = 0; k < nNum; k++ )
        {
            if ( i == k )
            {
                Vec_WecPush( vProds,  i+k, pNum[i] );
                Vec_WecPush( vLevels, i+k, 0 );
            }
            else if ( i < k )
            {
                Vec_WecPush( vProds,  i+k+1, Gia_ManHashAnd(pNew, pNum[i], pNum[k]) );
                Vec_WecPush( vLevels, i+k+1, 0 );
            }
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, 0, 0 );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}